

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O1

char * IoTHubMessage_GetString(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle)

{
  char *pcVar1;
  
  if ((iotHubMessageHandle != (IOTHUB_MESSAGE_HANDLE)0x0) &&
     (iotHubMessageHandle->contentType == IOTHUBMESSAGE_STRING)) {
    pcVar1 = STRING_c_str((iotHubMessageHandle->value).string);
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

const char* IoTHubMessage_GetString(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle)
{
    const char* result;
    if (iotHubMessageHandle == NULL)
    {
        result = NULL;
    }
    else
    {
        IOTHUB_MESSAGE_HANDLE_DATA* handleData = iotHubMessageHandle;
        if (handleData->contentType != IOTHUBMESSAGE_STRING)
        {
            result = NULL;
        }
        else
        {
            result = STRING_c_str(handleData->value.string);
        }
    }
    return result;
}